

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O0

int32_t __thiscall llama_context::output_reserve(llama_context *this,int32_t n_outputs)

{
  uint uVar1;
  bool bVar2;
  uint32_t uVar3;
  long *plVar4;
  vector<int,_std::allocator<int>_> *pvVar5;
  ulong uVar6;
  ggml_backend_dev_t pgVar7;
  pointer pgVar8;
  unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter> *puVar9;
  int in_ESI;
  llama_context *in_RDI;
  bool bVar10;
  undefined1 auVar11 [16];
  float *output_base;
  ggml_backend_buffer_type *output_dev_host_buft;
  ggml_backend_device *output_dev;
  ggml_backend_buffer_type *buft;
  size_t new_size;
  size_t prev_size;
  bool has_embd;
  bool has_logits;
  uint32_t n_embd;
  uint32_t n_vocab;
  uint32_t n_batch;
  int64_t n_outputs_max;
  llama_vocab *vocab;
  llama_hparams *hparams;
  pointer in_stack_ffffffffffffff28;
  unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter> *in_stack_ffffffffffffff30;
  unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter> *this_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff38;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff40;
  size_type in_stack_ffffffffffffff48;
  ulong uVar12;
  size_t local_a8;
  vector<int,_std::allocator<int>_> *local_68;
  byte local_4d;
  ulong local_40;
  long local_38;
  long local_30;
  llama_vocab *local_28;
  llama_hparams *local_20;
  
  local_20 = &in_RDI->model->hparams;
  local_28 = &in_RDI->model->vocab;
  local_38 = (long)in_ESI;
  uVar3 = n_seq_max(in_RDI);
  local_40 = (ulong)uVar3;
  plVar4 = std::max<long>(&local_38,(long *)&local_40);
  local_30 = *plVar4;
  uVar3 = llama_vocab::n_tokens((llama_vocab *)0x3d8c91);
  uVar1 = local_20->n_embd;
  local_4d = ((in_RDI->cparams).embeddings ^ 0xffU) & 1;
  bVar10 = false;
  if (((in_RDI->cparams).embeddings & 1U) != 0) {
    bVar10 = (in_RDI->cparams).pooling_type == LLAMA_POOLING_TYPE_NONE;
  }
  if (in_RDI->model->arch == LLM_ARCH_T5) {
    local_4d = 1;
    bVar10 = true;
  }
  if (local_4d == 0) {
    local_a8 = 0;
  }
  else {
    local_a8 = (ulong)uVar3 * local_30;
  }
  in_RDI->logits_size = local_a8;
  if (bVar10) {
    pvVar5 = (vector<int,_std::allocator<int>_> *)((ulong)uVar1 * local_30);
  }
  else {
    pvVar5 = (vector<int,_std::allocator<int>_> *)0x0;
  }
  in_RDI->embd_size = (size_t)pvVar5;
  bVar2 = std::vector<int,_std::allocator<int>_>::empty
                    ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff40._M_current);
  if (bVar2) {
    std::vector<int,_std::allocator<int>_>::resize(pvVar5,in_stack_ffffffffffffff48);
  }
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter> *)0x3d8db8);
  if (bVar2) {
    pgVar8 = std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>::get
                       (in_stack_ffffffffffffff30);
    uVar12 = ggml_backend_buffer_get_size(pgVar8);
  }
  else {
    uVar12 = 0;
  }
  uVar6 = (in_RDI->logits_size + in_RDI->embd_size) * 4;
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter> *)0x3d8e1c);
  if ((!bVar2) || (uVar12 < uVar6)) {
    bVar2 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter> *)0x3d8e46);
    if (bVar2) {
      std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>::operator=
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      in_RDI->logits = (float *)0x0;
      in_RDI->embd = (float *)0x0;
    }
    local_68 = (vector<int,_std::allocator<int>_> *)ggml_backend_cpu_buffer_type();
    pgVar7 = llama_model::dev_output((llama_model *)0x3d8e96);
    if (pgVar7 == (ggml_backend_dev_t)0x0) {
      in_stack_ffffffffffffff40._M_current = (int *)0x0;
    }
    else {
      in_stack_ffffffffffffff40._M_current = (int *)ggml_backend_dev_host_buffer_type(pgVar7);
    }
    if ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff40._M_current !=
        (vector<int,_std::allocator<int>_> *)0x0) {
      local_68 = (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff40._M_current;
    }
    in_stack_ffffffffffffff38._M_current = (int *)&in_RDI->buf_output;
    ggml_backend_buft_alloc_buffer(local_68,uVar6);
    std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>::reset
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    bVar2 = std::operator==(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    if (bVar2) {
      auVar11._8_4_ = (int)(uVar6 >> 0x20);
      auVar11._0_8_ = uVar6;
      auVar11._12_4_ = 0x45300000;
      llama_log_internal((ggml_log_level)
                         (((auVar11._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0)) /
                         1048576.0),(char *)0x4,
                         "%s: failed to allocate output buffer of size %.2f MiB\n","output_reserve")
      ;
      return 0;
    }
  }
  pgVar8 = std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>::get
                     (in_stack_ffffffffffffff30);
  puVar9 = (unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter> *)
           ggml_backend_buffer_get_base(pgVar8);
  this_00 = puVar9;
  if (local_4d == 0) {
    this_00 = (unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter> *)0x0;
  }
  in_RDI->logits = (float *)this_00;
  if (bVar10) {
    pvVar5 = (vector<int,_std::allocator<int>_> *)
             ((long)&(puVar9->_M_t).
                     super___uniq_ptr_impl<ggml_backend_buffer,_ggml_backend_buffer_deleter>._M_t.
                     super__Tuple_impl<0UL,_ggml_backend_buffer_*,_ggml_backend_buffer_deleter>.
                     super__Head_base<0UL,_ggml_backend_buffer_*,_false>._M_head_impl +
             in_RDI->logits_size * 4);
  }
  else {
    pvVar5 = (vector<int,_std::allocator<int>_> *)0x0;
  }
  in_RDI->embd = (float *)pvVar5;
  std::vector<int,_std::allocator<int>_>::begin(pvVar5);
  std::vector<int,_std::allocator<int>_>::end(pvVar5);
  std::fill<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,(int *)this_00);
  pgVar8 = std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>::get(this_00);
  ggml_backend_buffer_clear(pgVar8,0);
  in_RDI->n_outputs = 0;
  in_RDI->n_outputs_max = (int32_t)local_30;
  return (int32_t)local_30;
}

Assistant:

int32_t llama_context::output_reserve(int32_t n_outputs) {
    const auto & hparams = model.hparams;
    const auto & vocab   = model.vocab;

    const int64_t n_outputs_max = std::max<int64_t>(n_outputs, n_seq_max());

    const auto n_batch = cparams.n_batch;
    const auto n_vocab = vocab.n_tokens();
    const auto n_embd  = hparams.n_embd;

    // TODO: use a per-batch flag for logits presence instead
    bool has_logits = !cparams.embeddings;
    bool has_embd   =  cparams.embeddings && (cparams.pooling_type == LLAMA_POOLING_TYPE_NONE);

    // TODO: hacky enc-dec support
    if (model.arch == LLM_ARCH_T5) {
        has_logits = true;
        has_embd   = true;
    }

    logits_size = has_logits ? n_vocab*n_outputs_max : 0;
    embd_size   = has_embd   ?  n_embd*n_outputs_max : 0;

    if (output_ids.empty()) {
        // init, never resized afterwards
        output_ids.resize(n_batch);
    }

    const size_t prev_size = buf_output ? ggml_backend_buffer_get_size(buf_output.get()) : 0;
    const size_t new_size  = (logits_size + embd_size) * sizeof(float);

    // alloc only when more than the current capacity is required
    // TODO: also consider shrinking the buffer
    if (!buf_output || prev_size < new_size) {
        if (buf_output) {
#ifndef NDEBUG
            // This doesn't happen often, but may be annoying in some cases (like the HellaSwag benchmark)
            LLAMA_LOG_INFO("%s: reallocating output buffer from size %.02f MiB to %.02f MiB\n", __func__, prev_size / 1024.0 / 1024.0, new_size / 1024.0 / 1024.0);
#endif
            buf_output = nullptr;
            logits = nullptr;
            embd = nullptr;
        }

        auto * buft = ggml_backend_cpu_buffer_type();
        // try to use the host buffer of the device where the output tensor is allocated for faster transfer to system memory
        auto * output_dev = model.dev_output();
        auto * output_dev_host_buft = output_dev ? ggml_backend_dev_host_buffer_type(output_dev) : nullptr;
        if (output_dev_host_buft) {
            buft = output_dev_host_buft;
        }
        buf_output.reset(ggml_backend_buft_alloc_buffer(buft, new_size));
        if (buf_output == nullptr) {
            LLAMA_LOG_ERROR("%s: failed to allocate output buffer of size %.2f MiB\n", __func__, new_size / (1024.0 * 1024.0));
            return 0;
        }
    }

    float * output_base = (float *) ggml_backend_buffer_get_base(buf_output.get());

    logits = has_logits ? output_base               : nullptr;
    embd   = has_embd   ? output_base + logits_size : nullptr;

    // set all ids as invalid (negative)
    std::fill(output_ids.begin(), output_ids.end(), -1);

    ggml_backend_buffer_clear(buf_output.get(), 0);

    this->n_outputs     = 0;
    this->n_outputs_max = n_outputs_max;

    return n_outputs_max;
}